

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcFurnitureStandard::~IfcFurnitureStandard(IfcFurnitureStandard *this)

{
  ~IfcFurnitureStandard
            ((IfcFurnitureStandard *)&this[-1].super_IfcControl.super_IfcObject.field_0x70);
  return;
}

Assistant:

IfcFurnitureStandard() : Object("IfcFurnitureStandard") {}